

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O3

void __thiscall tonk::BandwidthEstimator::OnInterval(BandwidthEstimator *this,uint intervalUsec)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  (this->Measurement).TimestampUsec = (this->Previous).ReceiveUsec;
  if (intervalUsec == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (uint)(((ulong)this->IntervalDatagramBytes * 1000000) / (ulong)intervalUsec);
  }
  (this->Measurement).LatestProbeBPS = uVar6;
  iVar7 = (int)(this->Previous).Nonce - (int)(this->Start).Nonce;
  iVar8 = iVar7 - this->IntervalInSeqCount;
  auVar12._4_12_ = in_ZMM0._4_12_;
  auVar12._0_4_ = (uint)(0 < iVar7) * (uint)(0 < iVar8) * (int)((float)iVar8 / (float)iVar7);
  auVar12 = vfmadd132ss_fma(ZEXT416((uint)(this->Measurement).SmoothedPLR),auVar12,
                            ZEXT416(0x40e00000));
  (this->Measurement).SmoothedPLR = auVar12._0_4_ * 0.125;
  uVar1 = (this->Measurement).SmoothedGoodputBPS;
  uVar9 = uVar1 * 7 + uVar6 >> 3;
  if (uVar1 == 0) {
    uVar9 = uVar6;
  }
  (this->Measurement).SmoothedGoodputBPS = uVar9;
  auVar4._0_4_ = this->IntervalMaxTripUsec;
  auVar4._4_4_ = *(undefined4 *)&this->field_0x84;
  auVar4._8_8_ = this->NextExpectedNonce;
  uVar5._0_4_ = (this->Measurement).SmoothedMaxTripUsec;
  uVar5._4_4_ = (this->Measurement).SmoothedMinTripUsec;
  auVar4 = vpinsrd_avx(auVar4,(this->Previous).NetworkTripUsec,1);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar5;
  auVar12 = vpslld_avx(auVar10,3);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar5;
  uVar5 = vptestmd_avx512vl(auVar10,auVar11);
  auVar12 = vpsubd_avx(auVar12,auVar11);
  auVar12 = vpaddd_avx(auVar12,auVar4);
  auVar12 = vpsrld_avx512vl(auVar12,3);
  bVar2 = (bool)((byte)(uVar5 & 0xf) & 1);
  bVar3 = (bool)((byte)((uVar5 & 0xf) >> 1) & 1);
  (this->Measurement).SmoothedMaxTripUsec =
       (uint)bVar2 * auVar12._0_4_ | (uint)!bVar2 * auVar4._0_4_;
  (this->Measurement).SmoothedMinTripUsec =
       (uint)bVar3 * auVar12._4_4_ | (uint)!bVar3 * auVar4._4_4_;
  uVar6 = (this->Previous).ReceiveSendDeltaTS24.Value;
  (this->Measurement).MinReceiveSendDeltaTS24.Value = uVar6;
  uVar1 = (this->InterPacketGap).MaxUsec;
  if (uVar1 != 0) {
    (this->InterPacketGap).SmoothedMaxUsec = (this->InterPacketGap).SmoothedMaxUsec * 7 + uVar1 >> 3
    ;
    (this->InterPacketGap).MaxUsec = 0;
  }
  (this->Start).NetworkTripUsec = (this->Previous).NetworkTripUsec;
  (this->Start).Nonce = (this->Previous).Nonce;
  (this->Start).SendTS24.Value = (this->Previous).SendTS24.Value;
  (this->Start).ReceiveUsec = (this->Previous).ReceiveUsec;
  (this->Start).DatagramBytes = (this->Previous).DatagramBytes;
  (this->Start).ReceiveSendDeltaTS24.Value = uVar6;
  this->IntervalDatagramBytes = 0;
  this->IntervalInSeqCount = 0;
  return;
}

Assistant:

void BandwidthEstimator::OnInterval(const unsigned intervalUsec)
{
    // Record timestamp for the burst
    Measurement.TimestampUsec = Previous.ReceiveUsec;

    {
        // Calculate receive BPS
        const uint64_t scaledBytes = (uint64_t)IntervalDatagramBytes * 1000000ULL;
        const unsigned receiveBPS = intervalUsec > 0 ? (unsigned)(scaledBytes / intervalUsec) : 0;
        Measurement.LatestProbeBPS = receiveBPS;
    }

    // Calculate send BPS
    //const Counter24 sendIntervalTS24 = Previous.SendTS24 - Start.SendTS24;
    //const unsigned sendIntervalUsec = sendIntervalTS24.ToUnsigned() << kTime23LostBits;
    //Measurement.LatestGoodputBPS = sendIntervalUsec > 0 ? (unsigned)(scaledBytes / sendIntervalUsec) : 0;

    // Calculate PLR
    const int expected = (int)(int64_t)(Previous.Nonce - Start.Nonce);
    const int lossCount = expected - (int)IntervalInSeqCount;
    TONK_DEBUG_ASSERT(lossCount >= 0);

    float plr = 0.f;
    if (expected > 0 && lossCount > 0) {
        plr = (unsigned)lossCount / (float)expected;
    }

    // Smooth the received PLR using EWMA
    Measurement.SmoothedPLR = (Measurement.SmoothedPLR * 7.f + plr) / 8.f;

    // Smooth the received BPS using EWMA
    if (Measurement.SmoothedGoodputBPS == 0) {
        Measurement.SmoothedGoodputBPS = Measurement.LatestProbeBPS;
    }
    else {
        Measurement.SmoothedGoodputBPS = (Measurement.SmoothedGoodputBPS * 7 + Measurement.LatestProbeBPS) / 8;
    }

    // Smooth the minimum trip time estimate
    const unsigned minTripUsec = Previous.NetworkTripUsec;
    if (Measurement.SmoothedMinTripUsec == 0) {
        Measurement.SmoothedMinTripUsec = minTripUsec;
    }
    else {
        Measurement.SmoothedMinTripUsec = (Measurement.SmoothedMinTripUsec * 7 + minTripUsec) / 8;
    }

    // Smooth the maximum trip time estimate
    const unsigned maxTripUsec = IntervalMaxTripUsec;
    if (Measurement.SmoothedMaxTripUsec == 0) {
        Measurement.SmoothedMaxTripUsec = maxTripUsec;
    }
    else {
        Measurement.SmoothedMaxTripUsec = (Measurement.SmoothedMaxTripUsec * 7 + maxTripUsec) / 8;
    }

    // Record the smallest ReceiveSendDeltaTS24
    Measurement.MinReceiveSendDeltaTS24 = Previous.ReceiveSendDeltaTS24;

    // Update statistics
    InterPacketGap.OnIntervalEnd();

    TONK_VERBOSE_BANDWIDTH_LOG(
        "ProbeBPS=", Measurement.LatestProbeBPS,
        " Goodput=", Measurement.SmoothedGoodputBPS,
        " MinTrip=", Previous.NetworkTripUsec,
        " Interval=", intervalUsec,
        " Bytes=", IntervalDatagramBytes,
        " Count=", IntervalInSeqCount,
        " PLR=", Measurement.SmoothedPLR,
        " AvgMin=", Measurement.SmoothedMinTripUsec,
        " AvgMax=", Measurement.SmoothedMaxTripUsec,
        " IPG=", InterPacketGap.Get());

    // Reset interval sampling
    Start = Previous;
    IntervalDatagramBytes = 0;
    IntervalInSeqCount = 0;
}